

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alstring.cpp
# Opt level: O1

int al::strncasecmp(char *__s1,char *__s2,size_t __n)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int unaff_R13D;
  
  if (__n == 0) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    do {
      bVar1 = __s1[lVar6];
      iVar3 = toupper((uint)bVar1);
      bVar2 = __s2[lVar6];
      iVar4 = toupper((uint)bVar2);
      if (iVar3 != iVar4) {
        unaff_R13D = 1;
      }
      if (iVar3 < iVar4) {
        unaff_R13D = -1;
      }
      iVar5 = unaff_R13D;
    } while ((((iVar3 == iVar4) && (iVar5 = 0, __n - 1 != lVar6)) && (bVar1 != 0)) &&
            (lVar6 = lVar6 + 1, bVar2 != 0));
  }
  return iVar5;
}

Assistant:

int strncasecmp(const char *str0, const char *str1, std::size_t len) noexcept
{
    if(len > 0)
    {
        do {
            const int diff{to_upper(*str0) - to_upper(*str1)};
            if(diff < 0) return -1;
            if(diff > 0) return 1;
        } while(--len && *(str0++) && *(str1++));
    }
    return 0;
}